

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::function_result_helper_struct_type_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_service *tservice,
          t_function *tfunction)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  t_function *local_28;
  t_function *tfunction_local;
  t_service *tservice_local;
  t_swift_generator *this_local;
  
  local_28 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  bVar1 = t_function::is_oneway(tfunction);
  if (bVar1) {
    iVar2 = (*(tfunction_local->super_t_doc)._vptr_t_doc[3])();
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2),"_");
    psVar3 = t_function::get_name_abi_cxx11_(local_28);
    std::operator+(__return_storage_ptr__,&local_48,psVar3);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    iVar2 = (*(tfunction_local->super_t_doc)._vptr_t_doc[3])();
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2),"_");
    psVar3 = t_function::get_name_abi_cxx11_(local_28);
    std::operator+(&local_78,&local_98,psVar3);
    std::operator+(__return_storage_ptr__,&local_78,"_result");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_result_helper_struct_type(t_service *tservice, t_function* tfunction) {
  if (tfunction->is_oneway()) {
    return tservice->get_name() + "_" + tfunction->get_name();
  } else {
    return tservice->get_name() + "_" + tfunction->get_name() + "_result";
  }
}